

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_protocol_init(lws_context *context)

{
  ushort uVar1;
  int iVar2;
  lws_log_cx *plVar3;
  int iVar4;
  lws_vhost *vh;
  int any;
  
  vh = context->vhost_list;
  any = 0;
  if (-1 < (char)*(ushort *)&context->field_0x7b7) {
    *(ushort *)&context->field_0x7b7 = *(ushort *)&context->field_0x7b7 | 0x80;
    plVar3 = lwsl_context_get_cx(context);
    _lws_log_cx(plVar3,lws_log_prepend_context,context,8,"lws_protocol_init","\n");
    iVar4 = 0;
    for (; vh != (lws_vhost *)0x0; vh = vh->vhost_next) {
      if (((vh->field_0x368 & 2) == 0) && ((vh->options & 0x2000000) == 0)) {
        iVar2 = lws_protocol_init_vhost(vh,&any);
        if (iVar2 != 0) {
          _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,2,"lws_protocol_init",
                      "init vhost %s failed",vh->name);
          iVar4 = -1;
        }
      }
    }
    uVar1 = *(ushort *)&context->field_0x7b7 & 0xff7f;
    *(ushort *)&context->field_0x7b7 = uVar1;
    if (iVar4 != 0) {
      plVar3 = lwsl_context_get_cx(context);
      _lws_log_cx(plVar3,lws_log_prepend_context,context,2,"lws_protocol_init",
                  "some protocols did not init");
      uVar1 = *(ushort *)&context->field_0x7b7;
    }
    if ((uVar1 & 0x40) == 0) {
      *(ushort *)&context->field_0x7b7 = uVar1 | 0x40;
      lws_finalize_startup(context);
    }
    else if (any != 0) {
      lws_tls_check_all_cert_lifetimes(context);
    }
  }
  return 0;
}

Assistant:

int
lws_protocol_init(struct lws_context *context)
{
	struct lws_vhost *vh = context->vhost_list;
	int any = 0, r = 0;

	if (context->doing_protocol_init)
		return 0;

	context->doing_protocol_init = 1;

	lwsl_cx_info(context, "\n");

	while (vh) {

		/* only do the protocol init once for a given vhost */
		if (vh->created_vhost_protocols ||
		    (lws_check_opt(vh->options, LWS_SERVER_OPTION_SKIP_PROTOCOL_INIT)))
			goto next;

		if (lws_protocol_init_vhost(vh, &any)) {
			lwsl_vhost_warn(vh, "init vhost %s failed", vh->name);
			r = -1;
		}
next:
		vh = vh->vhost_next;
	}

	context->doing_protocol_init = 0;

	if (r)
		lwsl_cx_warn(context, "some protocols did not init");

	if (!context->protocol_init_done) {

		context->protocol_init_done = 1;
		lws_finalize_startup(context);

		return 0;
	}

#if defined(LWS_WITH_SERVER)
	if (any) {
		lws_tls_check_all_cert_lifetimes(context);
	}
#endif

	return 0;
}